

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O0

void SUNDlsMat_bandCopy(sunrealtype **a,sunrealtype **b,sunindextype n,sunindextype a_smu,
                       sunindextype b_smu,sunindextype copymu,sunindextype copyml)

{
  sunrealtype *psVar1;
  sunrealtype *psVar2;
  sunrealtype *b_col_j;
  sunrealtype *a_col_j;
  sunindextype copySize;
  sunindextype j;
  sunindextype i;
  sunindextype copymu_local;
  sunindextype b_smu_local;
  sunindextype a_smu_local;
  sunindextype n_local;
  sunrealtype **b_local;
  sunrealtype **a_local;
  
  for (j = 0; j < n; j = j + 1) {
    psVar1 = a[j];
    psVar2 = b[j];
    for (i = 0; i < copymu + copyml + 1; i = i + 1) {
      psVar2[b_smu + (i - copymu)] = psVar1[a_smu + (i - copymu)];
    }
  }
  return;
}

Assistant:

void SUNDlsMat_bandCopy(sunrealtype** a, sunrealtype** b, sunindextype n,
                        sunindextype a_smu, sunindextype b_smu,
                        sunindextype copymu, sunindextype copyml)
{
  sunindextype i, j, copySize;
  sunrealtype *a_col_j, *b_col_j;

  copySize = copymu + copyml + 1;

  for (j = 0; j < n; j++)
  {
    a_col_j = a[j] + a_smu - copymu;
    b_col_j = b[j] + b_smu - copymu;
    for (i = 0; i < copySize; i++) { b_col_j[i] = a_col_j[i]; }
  }
}